

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O3

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::getIVec3
          (anon_unknown_1 *this,Functions *gl,deUint32 pname)

{
  GLenum err;
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar4;
  int ndx;
  long lVar5;
  IVec3 IVar6;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  code *local_30;
  deUint32 local_28;
  
  *(undefined4 *)(this + 8) = 0xffffffff;
  *(undefined8 *)this = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    (*gl->getIntegeri_v)(pname,(GLuint)lVar5,(GLint *)this);
    lVar5 = lVar5 + 1;
    this = this + 4;
  } while (lVar5 != 3);
  err = (*gl->getError)();
  local_30 = glu::getGettableStateName;
  local_28 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_30);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1c8a3ed);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  glu::checkError(err,(char *)local_70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x51);
  iVar4 = extraout_EDX;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
    iVar4 = extraout_EDX_00;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
    iVar4 = extraout_EDX_01;
  }
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    paVar2 = extraout_RAX;
    iVar4 = extraout_EDX_02;
  }
  IVar6.m_data[2] = iVar4;
  IVar6.m_data._0_8_ = paVar2;
  return (IVec3)IVar6.m_data;
}

Assistant:

static tcu::IVec3 getIVec3 (const glw::Functions& gl, deUint32 pname)
{
	tcu::IVec3 value(-1);
	for (int ndx = 0; ndx < 3; ndx++)
		gl.getIntegeri_v(pname, (glw::GLuint)ndx, &value[ndx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegeri_v(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}